

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O1

SW_FT_Error
SW_FT_Stroker_GetBorderCounts
          (SW_FT_Stroker stroker,SW_FT_StrokerBorder border,SW_FT_UInt *anum_points,
          SW_FT_UInt *anum_contours)

{
  SW_FT_Error SVar1;
  SW_FT_UInt num_contours;
  SW_FT_UInt num_points;
  SW_FT_UInt local_18 [2];
  
  local_18[0] = 0;
  local_18[1] = 0;
  SVar1 = -1;
  if ((int)border < 2 && stroker != (SW_FT_Stroker)0x0) {
    ft_stroke_border_get_counts(stroker->borders + (int)border,local_18 + 1,local_18);
    SVar1 = 0;
  }
  if (anum_points != (SW_FT_UInt *)0x0) {
    *anum_points = local_18[1];
  }
  if (anum_contours != (SW_FT_UInt *)0x0) {
    *anum_contours = local_18[0];
  }
  return SVar1;
}

Assistant:

SW_FT_Error SW_FT_Stroker_GetBorderCounts(SW_FT_Stroker       stroker,
                                          SW_FT_StrokerBorder border,
                                          SW_FT_UInt*         anum_points,
                                          SW_FT_UInt*         anum_contours)
{
    SW_FT_UInt  num_points = 0, num_contours = 0;
    SW_FT_Error error;

    if (!stroker || border > 1) {
        error = -1;  // SW_FT_THROW( Invalid_Argument );
        goto Exit;
    }

    error = ft_stroke_border_get_counts(stroker->borders + border, &num_points,
                                        &num_contours);
Exit:
    if (anum_points) *anum_points = num_points;

    if (anum_contours) *anum_contours = num_contours;

    return error;
}